

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher-chachapoly.c
# Opt level: O3

int chachapoly_crypt(chachapoly_ctx *ctx,u_int seqnr,u_char *dest,u_char *src,u_int len,u_int aadlen
                    ,int do_encrypt)

{
  undefined1 auVar1 [13];
  undefined1 auVar2 [13];
  u_char *c;
  int iVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  u_char one [8];
  u8 local_90 [8];
  u_char *local_88;
  u8 local_80 [8];
  uint local_78 [6];
  u8 *local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_80[0] = '\x01';
  local_80[1] = '\0';
  local_80[2] = '\0';
  local_80[3] = '\0';
  local_80[4] = '\0';
  local_80[5] = '\0';
  local_80[6] = '\0';
  local_80[7] = '\0';
  local_58 = (undefined1  [16])0x0;
  local_48 = (undefined1  [16])0x0;
  local_88 = dest;
  local_60 = local_90;
  _libssh2_store_u64(&local_60,(ulong)seqnr);
  chacha_ivsetup(&ctx->main_ctx,local_90,(u8 *)0x0);
  chacha_encrypt_bytes(&ctx->main_ctx,local_58,local_58,0x20);
  uVar6 = (ulong)aadlen;
  if (do_encrypt == 0) {
    poly1305_auth((uchar *)local_78,src,(ulong)(aadlen + len),local_58);
    lVar4 = 0;
    auVar7 = (undefined1  [16])0x0;
    do {
      uVar5 = *(uint *)(src + lVar4 + uVar6 + len) ^ *(uint *)((long)local_78 + lVar4);
      auVar1[0xc] = (char)(uVar5 >> 0x18);
      auVar1._0_12_ = ZEXT712(0);
      auVar2[1] = 0;
      auVar2[0] = (byte)(uVar5 >> 0x10);
      auVar2._2_3_ = auVar1._10_3_;
      auVar2._5_8_ = 0;
      auVar9[5] = 0;
      auVar9[4] = (byte)(uVar5 >> 8);
      auVar9._6_7_ = SUB137(auVar2 << 0x40,6);
      auVar9._0_4_ = uVar5 & 0xff;
      auVar9._13_3_ = 0;
      auVar7 = auVar7 | auVar9;
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x10);
    auVar8._0_4_ = -(uint)(auVar7._0_4_ == 0);
    auVar8._4_4_ = -(uint)(auVar7._4_4_ == 0);
    auVar8._8_4_ = -(uint)(auVar7._8_4_ == 0);
    auVar8._12_4_ = -(uint)(auVar7._12_4_ == 0);
    iVar3 = movmskps(0x10,auVar8);
    if (iVar3 != 0xf) {
      return -0xc;
    }
  }
  c = local_88;
  if (aadlen != 0) {
    chacha_ivsetup(&ctx->header_ctx,local_90,(u8 *)0x0);
    chacha_encrypt_bytes(&ctx->header_ctx,src,c,aadlen);
  }
  chacha_ivsetup(&ctx->main_ctx,local_90,local_80);
  chacha_encrypt_bytes(&ctx->main_ctx,src + uVar6,c + uVar6,len);
  if (do_encrypt != 0) {
    poly1305_auth(c + uVar6 + len,c,(ulong)(aadlen + len),local_58);
  }
  return 0;
}

Assistant:

int
chachapoly_crypt(struct chachapoly_ctx *ctx, u_int seqnr, u_char *dest,
                 const u_char *src, u_int len, u_int aadlen, int do_encrypt)
{
    u_char seqbuf[8];
    const u_char one[8] = { 1, 0, 0, 0, 0, 0, 0, 0 }; /* NB little-endian */
    u_char expected_tag[POLY1305_TAGLEN], poly_key[POLY1305_KEYLEN];
    int r = LIBSSH2_ERROR_INVAL;
    unsigned char *ptr = NULL;

    /*
     * Run ChaCha20 once to generate the Poly1305 key. The IV is the
     * packet sequence number.
     */
    memset(poly_key, 0, sizeof(poly_key));
    ptr = &seqbuf[0];
    _libssh2_store_u64(&ptr, seqnr);
    chacha_ivsetup(&ctx->main_ctx, seqbuf, NULL);
    chacha_encrypt_bytes(&ctx->main_ctx,
                         poly_key, poly_key, sizeof(poly_key));

    /* If decrypting, check tag before anything else */
    if(!do_encrypt) {
        const u_char *tag = src + aadlen + len;

        poly1305_auth(expected_tag, src, aadlen + len, poly_key);
        if(chachapoly_timingsafe_bcmp(expected_tag, tag, POLY1305_TAGLEN)
           != 0) {
            r = LIBSSH2_ERROR_DECRYPT;
            goto out;
        }
    }

    /* Crypt additional data */
    if(aadlen) {
        chacha_ivsetup(&ctx->header_ctx, seqbuf, NULL);
        chacha_encrypt_bytes(&ctx->header_ctx, src, dest, aadlen);
    }

    /* Set Chacha's block counter to 1 */
    chacha_ivsetup(&ctx->main_ctx, seqbuf, one);
    chacha_encrypt_bytes(&ctx->main_ctx, src + aadlen,
                         dest + aadlen, len);

    /* If encrypting, calculate and append tag */
    if(do_encrypt) {
        poly1305_auth(dest + aadlen + len, dest, aadlen + len,
                      poly_key);
    }
    r = 0;
out:
    memset(expected_tag, 0, sizeof(expected_tag));
    memset(seqbuf, 0, sizeof(seqbuf));
    memset(poly_key, 0, sizeof(poly_key));
    return r;
}